

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::sent_syn(session_impl *this,bool ipv6)

{
  int iVar1;
  int overhead;
  bool ipv6_local;
  session_impl *this_local;
  
  iVar1 = 0x28;
  if (ipv6) {
    iVar1 = 0x3c;
  }
  counters::inc_stats_counter(&this->m_stats_counters,0x81,(long)iVar1);
  stat::sent_syn(&this->m_stat,ipv6);
  return;
}

Assistant:

void session_impl::sent_syn(bool ipv6)
	{
		int const overhead = ipv6 ? 60 : 40;
		m_stats_counters.inc_stats_counter(counters::sent_ip_overhead_bytes
			, overhead);

		m_stat.sent_syn(ipv6);
	}